

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyalloc.c
# Opt level: O0

void tommy_allocator_init(tommy_allocator *alloc,tommy_size_t block_size,tommy_size_t align_size)

{
  long lVar1;
  long in_FS_OFFSET;
  ulong local_28;
  tommy_size_t align_size_local;
  tommy_size_t block_size_local;
  tommy_allocator *alloc_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = align_size;
  if (align_size < 8) {
    local_28 = 8;
  }
  align_size_local = block_size;
  if (block_size % local_28 != 0) {
    align_size_local = (local_28 - block_size % local_28) + block_size;
  }
  alloc->block_size = align_size_local;
  alloc->align_size = local_28;
  alloc->count = 0;
  alloc->free_block = (tommy_allocator_entry_struct *)0x0;
  alloc->used_segment = (tommy_allocator_entry_struct *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_allocator_init(tommy_allocator* alloc, tommy_size_t block_size, tommy_size_t align_size)
{
	/* setup the minimal alignment */
	if (align_size < sizeof(void*))
		align_size = sizeof(void*);

	/* ensure that the block_size keeps the alignment */
	if (block_size % align_size != 0)
		block_size += align_size - block_size % align_size;

	alloc->block_size = block_size;
	alloc->align_size = align_size;

	alloc->count = 0;
	alloc->free_block = 0;
	alloc->used_segment = 0;
}